

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall Fl_Text_Buffer::replace(Fl_Text_Buffer *this,int start,int end,char *text)

{
  int nInserted;
  char *deletedText;
  
  if (text != (char *)0x0) {
    if (start < 1) {
      start = 0;
    }
    if (this->mLength < end) {
      end = this->mLength;
    }
    call_predelete_callbacks(this,start,end - start);
    deletedText = text_range(this,start,end);
    remove_(this,start,end);
    nInserted = insert_(this,start,text);
    this->mCursorPosHint = nInserted + start;
    call_modify_callbacks(this,start,end - start,nInserted,0,deletedText);
    free(deletedText);
    return;
  }
  return;
}

Assistant:

void Fl_Text_Buffer::replace(int start, int end, const char *text)
{
  // Range check...
  if (!text)
    return;
  if (start < 0)
    start = 0;
  if (end > mLength)
    end = mLength;

  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))
  IS_UTF8_ALIGNED(text)
  
  call_predelete_callbacks(start, end - start);
  const char *deletedText = text_range(start, end);
  remove_(start, end);
  int nInserted = insert_(start, text);
  mCursorPosHint = start + nInserted;
  call_modify_callbacks(start, end - start, nInserted, 0, deletedText);
  free((void *) deletedText);
}